

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.h
# Opt level: O1

void chacha20_poly1305_seal
               (uint8_t *out_ciphertext,uint8_t *plaintext,size_t plaintext_len,uint8_t *ad,
               size_t ad_len,chacha20_poly1305_seal_data *data)

{
  uint32_t uVar1;
  
  uVar1 = OPENSSL_get_ia32cap(2);
  if ((~uVar1 & 0x120) == 0) {
    chacha20_poly1305_seal_avx2();
    return;
  }
  chacha20_poly1305_seal_sse41(out_ciphertext,plaintext,plaintext_len,ad,ad_len,data);
  return;
}

Assistant:

inline void chacha20_poly1305_seal(uint8_t *out_ciphertext,
                                   const uint8_t *plaintext,
                                   size_t plaintext_len, const uint8_t *ad,
                                   size_t ad_len,
                                   union chacha20_poly1305_seal_data *data) {
  if (CRYPTO_is_AVX2_capable() && CRYPTO_is_BMI2_capable()) {
    chacha20_poly1305_seal_avx2(out_ciphertext, plaintext, plaintext_len, ad,
                                ad_len, data);
  } else {
    chacha20_poly1305_seal_sse41(out_ciphertext, plaintext, plaintext_len, ad,
                                 ad_len, data);
  }
}